

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  undefined1 value [16];
  anon_class_40_4_2c7d0318 add_thousands_sep;
  char *pcVar1;
  int digit_index;
  const_iterator group;
  undefined4 in_stack_ffffffffffffffc0;
  undefined8 local_10;
  
  local_10 = **(undefined8 **)(this + 0x18);
  value._8_8_ = this + 0x20;
  value._0_8_ = this;
  add_thousands_sep.s.data_ = (char *)&local_10;
  add_thousands_sep.this = (num_writer *)0x1;
  add_thousands_sep.s.size_ = (size_t)&stack0xffffffffffffffc4;
  add_thousands_sep.group._0_4_ = in_stack_ffffffffffffffc0;
  add_thousands_sep.group._4_4_ = 0;
  add_thousands_sep.digit_index = (int *)this;
  pcVar1 = internal::operator()
                     (*it,(unsigned___int128)value,(int)*(undefined8 *)this,add_thousands_sep);
  *it = pcVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
        basic_string_view<char_type> s(&sep, sep_size);
        // Index of a decimal digit with the least significant digit having
        // index 0.
        int digit_index = 0;
        std::string::const_iterator group = groups.cbegin();
        it = format_decimal<char_type>(
            it, abs_value, size,
            [this, s, &group, &digit_index](char_type*& buffer) {
              if (*group <= 0 || ++digit_index % *group != 0 ||
                  *group == max_value<char>())
                return;
              if (group + 1 != groups.cend()) {
                digit_index = 0;
                ++group;
              }
              buffer -= s.size();
              std::uninitialized_copy(s.data(), s.data() + s.size(),
                                      make_checked(buffer, s.size()));
            });
      }